

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O3

void tree_sitter_bash_external_scanner_deserialize(void *payload,char *state,uint length)

{
  undefined8 *puVar1;
  byte bVar2;
  void *pvVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  
  if (length == 0) {
    uVar11 = *(uint *)((long)payload + 0x10);
    if (uVar11 != 0) {
      lVar5 = 0x10;
      uVar7 = 0;
      do {
        lVar10 = *(long *)((long)payload + 8);
        *(undefined2 *)(lVar10 + -0x10 + lVar5) = 0;
        *(undefined1 *)(lVar10 + -0xe + lVar5) = 0;
        if ((ulong)*(uint *)(lVar10 + lVar5) != 0) {
          memset(*(void **)(lVar10 + -8 + lVar5),0,(ulong)*(uint *)(lVar10 + lVar5));
          *(undefined4 *)(lVar10 + lVar5) = 0;
          uVar11 = *(uint *)((long)payload + 0x10);
        }
        uVar7 = uVar7 + 1;
        lVar5 = lVar5 + 0x28;
      } while (uVar7 < uVar11);
    }
  }
  else {
    *(char *)payload = *state;
    *(bool *)((long)payload + 1) = state[1] != '\0';
    *(bool *)((long)payload + 2) = state[2] != '\0';
    bVar2 = state[3];
    if (bVar2 == 0) {
      uVar11 = 4;
    }
    else {
      uVar7 = 4;
      lVar5 = 0;
      uVar8 = 0;
      do {
        uVar9 = (ulong)*(uint *)((long)payload + 0x10);
        if (uVar8 < uVar9) {
          lVar10 = *(long *)((long)payload + 8) + lVar5;
        }
        else {
          uVar11 = *(uint *)((long)payload + 0x10) + 1;
          pvVar3 = *(void **)((long)payload + 8);
          if (*(uint *)((long)payload + 0x14) < uVar11) {
            uVar4 = *(uint *)((long)payload + 0x14) * 2;
            if (uVar4 <= uVar11) {
              uVar4 = uVar11;
            }
            if (uVar4 < 9) {
              uVar4 = 8;
            }
            if (pvVar3 == (void *)0x0) {
              pvVar3 = malloc((ulong)uVar4 * 0x28);
            }
            else {
              pvVar3 = realloc(pvVar3,(ulong)uVar4 * 0x28);
              uVar9 = (ulong)*(uint *)((long)payload + 0x10);
              uVar11 = *(uint *)((long)payload + 0x10) + 1;
            }
            *(void **)((long)payload + 8) = pvVar3;
            *(uint *)((long)payload + 0x14) = uVar4;
          }
          *(uint *)((long)payload + 0x10) = uVar11;
          puVar1 = (undefined8 *)((long)pvVar3 + uVar9 * 0x28 + 0x10);
          *puVar1 = 0;
          puVar1[1] = 0;
          puVar1 = (undefined8 *)((long)pvVar3 + uVar9 * 0x28);
          *puVar1 = 0;
          puVar1[1] = 0;
          *(undefined8 *)((long)pvVar3 + uVar9 * 0x28 + 0x20) = 0;
          if (*(int *)((long)payload + 0x10) == 0) {
            __assert_fail("(uint32_t)((&scanner->heredocs)->size - 1) < (&scanner->heredocs)->size",
                          "/workspace/llm4binary/github/license_c_cmakelists/tree-sitter[P]tree-sitter-bash/src/scanner.c"
                          ,0x89,"void deserialize(Scanner *, const char *, unsigned int)");
          }
          lVar10 = (ulong)(*(int *)((long)payload + 0x10) - 1) * 0x28 + *(long *)((long)payload + 8)
          ;
        }
        iVar6 = (int)uVar7;
        *(bool *)lVar10 = state[uVar7] != '\0';
        *(bool *)(lVar10 + 1) = state[iVar6 + 1] != '\0';
        *(bool *)(lVar10 + 2) = state[iVar6 + 2] != '\0';
        uVar11 = *(uint *)(state + (iVar6 + 3));
        *(uint *)(lVar10 + 0x10) = uVar11;
        uVar4 = uVar11;
        if (*(uint *)(lVar10 + 0x14) < uVar11) {
          if (*(void **)(lVar10 + 8) == (void *)0x0) {
            pvVar3 = malloc((ulong)uVar11);
          }
          else {
            pvVar3 = realloc(*(void **)(lVar10 + 8),(ulong)uVar11);
            uVar4 = *(uint *)(lVar10 + 0x10);
          }
          *(void **)(lVar10 + 8) = pvVar3;
          *(uint *)(lVar10 + 0x14) = uVar11;
        }
        uVar7 = (ulong)(iVar6 + 7U);
        if (uVar4 != 0) {
          memcpy(*(void **)(lVar10 + 8),state + uVar7,(ulong)uVar4);
          uVar7 = (ulong)(iVar6 + 7U + *(int *)(lVar10 + 0x10));
        }
        uVar11 = (uint)uVar7;
        uVar8 = uVar8 + 1;
        lVar5 = lVar5 + 0x28;
      } while ((ulong)bVar2 * 0x28 != lVar5);
    }
    if (uVar11 != length) {
      __assert_fail("size == length",
                    "/workspace/llm4binary/github/license_c_cmakelists/tree-sitter[P]tree-sitter-bash/src/scanner.c"
                    ,0x99,"void deserialize(Scanner *, const char *, unsigned int)");
    }
  }
  return;
}

Assistant:

static void deserialize(Scanner *scanner, const char *buffer, unsigned length) {
    if (length == 0) {
        reset(scanner);
    } else {
        uint32_t size = 0;
        scanner->last_glob_paren_depth = buffer[size++];
        scanner->ext_was_in_double_quote = buffer[size++];
        scanner->ext_saw_outside_quote = buffer[size++];
        uint32_t heredoc_count = (unsigned char)buffer[size++];
        for (uint32_t i = 0; i < heredoc_count; i++) {
            Heredoc *heredoc = NULL;
            if (i < scanner->heredocs.size) {
                heredoc = array_get(&scanner->heredocs, i);
            } else {
                Heredoc new_heredoc = heredoc_new();
                array_push(&scanner->heredocs, new_heredoc);
                heredoc = array_back(&scanner->heredocs);
            }

            heredoc->is_raw = buffer[size++];
            heredoc->started = buffer[size++];
            heredoc->allows_indent = buffer[size++];

            memcpy(&heredoc->delimiter.size, &buffer[size], sizeof(uint32_t));
            size += sizeof(uint32_t);
            array_reserve(&heredoc->delimiter, heredoc->delimiter.size);

            if (heredoc->delimiter.size > 0) {
                memcpy(heredoc->delimiter.contents, &buffer[size], heredoc->delimiter.size);
                size += heredoc->delimiter.size;
            }
        }
        assert(size == length);
    }
}